

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void get_4_nz_map_contexts_2d(uint8_t *levels,int width,ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  undefined8 uVar1;
  uint8_t *puVar2;
  undefined8 *in_RCX;
  int in_ESI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  int col;
  int8_t *cc;
  __m128i level [5];
  __m128i count;
  __m128i pos_to_offset;
  __m128i pos_to_offset_large;
  int stride;
  __m128i *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe34;
  undefined1 in_stack_fffffffffffffe35;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  undefined8 uVar3;
  uint8_t *src;
  int local_1b4;
  undefined8 *local_1b0;
  longlong local_1a8 [10];
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  uint8_t *puStack_140;
  undefined8 local_138;
  uint8_t *puStack_130;
  undefined4 local_124;
  undefined8 *local_120;
  long local_108;
  undefined1 local_f9;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 local_e0;
  undefined1 local_df;
  undefined1 local_de;
  undefined1 local_dd;
  undefined1 local_dc;
  undefined1 local_db;
  undefined1 local_da;
  undefined1 local_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  char cStack_c0;
  char cStack_bf;
  char cStack_be;
  char cStack_bd;
  char cStack_bc;
  char cStack_bb;
  char cStack_ba;
  char cStack_b9;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined8 local_58;
  uint8_t *puStack_50;
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_124 = 8;
  local_f9 = 0x15;
  local_31 = 0x15;
  local_32 = 0x15;
  local_33 = 0x15;
  local_34 = 0x15;
  local_35 = 0x15;
  local_36 = 0x15;
  local_37 = 0x15;
  local_38 = 0x15;
  local_39 = 0x15;
  local_3a = 0x15;
  local_3b = 0x15;
  local_3c = 0x15;
  local_3d = 0x15;
  local_3e = 0x15;
  local_3f = 0x15;
  local_40 = 0x15;
  local_138 = 0x1515151515151515;
  puStack_130 = (uint8_t *)0x1515151515151515;
  if (in_ESI == 4) {
    local_d9 = 0;
    local_da = 1;
    local_db = 6;
    local_dc = 6;
    local_dd = 1;
    local_de = 6;
    local_df = 6;
    local_e0 = 0x15;
    local_e1 = 6;
    local_e2 = 6;
    local_e3 = 0x15;
    local_e4 = 0x15;
    local_e5 = 6;
    local_e6 = 0x15;
    local_e7 = 0x15;
    local_e8 = 0x15;
    in_stack_fffffffffffffe36 = 0x15;
    in_stack_fffffffffffffe37 = 0;
    local_79 = 0x15;
    local_7a = 0x15;
    local_7b = 0x15;
    local_7c = 6;
    local_7d = 0x15;
    local_7e = 0x15;
    local_7f = 6;
    local_80 = 6;
    local_81 = 0x15;
    local_82 = 6;
    local_83 = 6;
    local_84 = 1;
    local_85 = 6;
    local_86 = 6;
    local_87 = 1;
    local_88 = 0;
    uVar3 = 0x1506060106060100;
    uStack_90 = 0x1515150615150606;
    local_98 = uVar3;
  }
  else {
    local_e9 = 0;
    local_ea = 0x10;
    local_eb = 0x10;
    local_ec = 0x10;
    local_ed = 0x10;
    local_ee = 0x10;
    local_ef = 0x10;
    local_f0 = 0x10;
    local_f1 = 6;
    local_f2 = 6;
    local_f3 = 0x15;
    local_f4 = 0x15;
    local_f5 = 6;
    local_f6 = 0x15;
    local_f7 = 0x15;
    local_f8 = 0x15;
    in_stack_fffffffffffffe34 = 0x15;
    in_stack_fffffffffffffe35 = 0;
    local_59 = 0x15;
    local_5a = 0x15;
    local_5b = 0x15;
    local_5c = 6;
    local_5d = 0x15;
    local_5e = 0x15;
    local_5f = 6;
    local_60 = 6;
    local_61 = 0x10;
    local_62 = 0x10;
    local_63 = 0x10;
    local_64 = 0x10;
    local_65 = 0x10;
    local_66 = 0x10;
    local_67 = 0x10;
    local_68 = 0;
    uVar3 = 0x1010101010101000;
    uStack_70 = 0x1515150615150606;
    local_78 = uVar3;
  }
  src = (uint8_t *)0x1515150615150606;
  local_1b4 = in_ESI;
  local_1b0 = in_RCX;
  local_148 = uVar3;
  puStack_140 = src;
  local_120 = in_RCX;
  local_108 = in_RDI;
  local_58 = local_138;
  puStack_50 = puStack_130;
  do {
    load_levels_4x4x5_sse2
              (src,(int)((ulong)uVar3 >> 0x20),
               (ptrdiff_t *)
               CONCAT17(in_stack_fffffffffffffe37,
                        CONCAT16(in_stack_fffffffffffffe36,
                                 CONCAT15(in_stack_fffffffffffffe35,
                                          CONCAT14(in_stack_fffffffffffffe34,
                                                   in_stack_fffffffffffffe30)))),
               in_stack_fffffffffffffe28);
    get_coeff_contexts_kernel_sse2((__m128i *)local_1a8);
    uVar1 = local_148;
    puVar2 = puStack_140;
    local_c8 = (char)extraout_XMM0_Qa;
    cStack_c7 = (char)((ulong)extraout_XMM0_Qa >> 8);
    cStack_c6 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
    cStack_c5 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
    cStack_c4 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
    cStack_c3 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
    cStack_c2 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
    cStack_c1 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
    cStack_c0 = (char)extraout_XMM0_Qb;
    cStack_bf = (char)((ulong)extraout_XMM0_Qb >> 8);
    cStack_be = (char)((ulong)extraout_XMM0_Qb >> 0x10);
    cStack_bd = (char)((ulong)extraout_XMM0_Qb >> 0x18);
    cStack_bc = (char)((ulong)extraout_XMM0_Qb >> 0x20);
    cStack_bb = (char)((ulong)extraout_XMM0_Qb >> 0x28);
    cStack_ba = (char)((ulong)extraout_XMM0_Qb >> 0x30);
    cStack_b9 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
    local_d8._0_1_ = (char)local_148;
    local_d8._1_1_ = (char)((ulong)local_148 >> 8);
    local_d8._2_1_ = (char)((ulong)local_148 >> 0x10);
    local_d8._3_1_ = (char)((ulong)local_148 >> 0x18);
    local_d8._4_1_ = (char)((ulong)local_148 >> 0x20);
    local_d8._5_1_ = (char)((ulong)local_148 >> 0x28);
    local_d8._6_1_ = (char)((ulong)local_148 >> 0x30);
    local_d8._7_1_ = (char)((ulong)local_148 >> 0x38);
    uStack_d0._0_1_ = (char)puStack_140;
    uStack_d0._1_1_ = (char)((ulong)puStack_140 >> 8);
    uStack_d0._2_1_ = (char)((ulong)puStack_140 >> 0x10);
    uStack_d0._3_1_ = (char)((ulong)puStack_140 >> 0x18);
    uStack_d0._4_1_ = (char)((ulong)puStack_140 >> 0x20);
    uStack_d0._5_1_ = (char)((ulong)puStack_140 >> 0x28);
    uStack_d0._6_1_ = (char)((ulong)puStack_140 >> 0x30);
    uStack_d0._7_1_ = (char)((ulong)puStack_140 >> 0x38);
    local_158 = CONCAT17(cStack_c1 + local_d8._7_1_,
                         CONCAT16(cStack_c2 + local_d8._6_1_,
                                  CONCAT15(cStack_c3 + local_d8._5_1_,
                                           CONCAT14(cStack_c4 + local_d8._4_1_,
                                                    CONCAT13(cStack_c5 + local_d8._3_1_,
                                                             CONCAT12(cStack_c6 + local_d8._2_1_,
                                                                      CONCAT11(cStack_c7 +
                                                                               local_d8._1_1_,
                                                                               local_c8 +
                                                                               (char)local_d8)))))))
    ;
    uStack_150 = CONCAT17(cStack_b9 + uStack_d0._7_1_,
                          CONCAT16(cStack_ba + uStack_d0._6_1_,
                                   CONCAT15(cStack_bb + uStack_d0._5_1_,
                                            CONCAT14(cStack_bc + uStack_d0._4_1_,
                                                     CONCAT13(cStack_bd + uStack_d0._3_1_,
                                                              CONCAT12(cStack_be + uStack_d0._2_1_,
                                                                       CONCAT11(cStack_bf +
                                                                                uStack_d0._1_1_,
                                                                                cStack_c0 +
                                                                                (char)uStack_d0)))))
                                  ));
    local_a0 = local_1b0;
    local_b8 = local_158;
    uStack_b0 = uStack_150;
    *local_1b0 = local_158;
    local_1b0[1] = uStack_150;
    local_148 = local_138;
    puStack_140 = puStack_130;
    local_108 = local_108 + 0x20;
    local_1b0 = local_1b0 + 2;
    local_1b4 = local_1b4 + -4;
    local_d8 = uVar1;
    uStack_d0 = puVar2;
  } while (local_1b4 != 0);
  *(undefined1 *)local_120 = 0;
  return;
}

Assistant:

static inline void get_4_nz_map_contexts_2d(const uint8_t *levels,
                                            const int width,
                                            const ptrdiff_t *const offsets,
                                            int8_t *const coeff_contexts) {
  const int stride = 4 + TX_PAD_HOR;
  const __m128i pos_to_offset_large = _mm_set1_epi8(21);
  __m128i pos_to_offset =
      (width == 4)
          ? _mm_setr_epi8(0, 1, 6, 6, 1, 6, 6, 21, 6, 6, 21, 21, 6, 21, 21, 21)
          : _mm_setr_epi8(0, 16, 16, 16, 16, 16, 16, 16, 6, 6, 21, 21, 6, 21,
                          21, 21);
  __m128i count;
  __m128i level[5];
  int8_t *cc = coeff_contexts;
  int col = width;

  assert(!(width % 4));

  do {
    load_levels_4x4x5_sse2(levels, stride, offsets, level);
    count = get_coeff_contexts_kernel_sse2(level);
    count = _mm_add_epi8(count, pos_to_offset);
    _mm_store_si128((__m128i *)cc, count);
    pos_to_offset = pos_to_offset_large;
    levels += 4 * stride;
    cc += 16;
    col -= 4;
  } while (col);

  coeff_contexts[0] = 0;
}